

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

KeyInfo * multiSelectOrderByKeyInfo(Parse *pParse,Select *p,int nExtra)

{
  ExprList *pEVar1;
  sqlite3 *db;
  KeyInfo *pKVar2;
  CollSeq *pCVar3;
  Expr *pEVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ExprList_item *pEVar8;
  
  pEVar1 = p->pOrderBy;
  if (pEVar1 == (ExprList *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = pEVar1->nExpr;
  }
  db = pParse->db;
  pKVar2 = sqlite3KeyInfoAlloc(db,uVar6 + 1,1);
  if (pKVar2 != (KeyInfo *)0x0) {
    pEVar8 = pEVar1->a;
    uVar5 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar5;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      pEVar4 = pEVar8->pExpr;
      if ((pEVar4->flags & 0x200) == 0) {
        pCVar3 = multiSelectCollSeq(pParse,p,(pEVar8->u).x.iOrderByCol - 1);
        if (pCVar3 == (CollSeq *)0x0) {
          pCVar3 = db->pDfltColl;
        }
        pEVar4 = sqlite3ExprAddCollateString(pParse,pEVar4,pCVar3->zName);
        pEVar8->pExpr = pEVar4;
      }
      else {
        pCVar3 = sqlite3ExprCollSeq(pParse,pEVar4);
      }
      pKVar2->aColl[uVar5] = pCVar3;
      pKVar2->aSortFlags[uVar5] = (pEVar8->fg).sortFlags;
      pEVar8 = pEVar8 + 1;
    }
  }
  return pKVar2;
}

Assistant:

static KeyInfo *multiSelectOrderByKeyInfo(Parse *pParse, Select *p, int nExtra){
  ExprList *pOrderBy = p->pOrderBy;
  int nOrderBy = ALWAYS(pOrderBy!=0) ? pOrderBy->nExpr : 0;
  sqlite3 *db = pParse->db;
  KeyInfo *pRet = sqlite3KeyInfoAlloc(db, nOrderBy+nExtra, 1);
  if( pRet ){
    int i;
    for(i=0; i<nOrderBy; i++){
      struct ExprList_item *pItem = &pOrderBy->a[i];
      Expr *pTerm = pItem->pExpr;
      CollSeq *pColl;

      if( pTerm->flags & EP_Collate ){
        pColl = sqlite3ExprCollSeq(pParse, pTerm);
      }else{
        pColl = multiSelectCollSeq(pParse, p, pItem->u.x.iOrderByCol-1);
        if( pColl==0 ) pColl = db->pDfltColl;
        pOrderBy->a[i].pExpr =
          sqlite3ExprAddCollateString(pParse, pTerm, pColl->zName);
      }
      assert( sqlite3KeyInfoIsWriteable(pRet) );
      pRet->aColl[i] = pColl;
      pRet->aSortFlags[i] = pOrderBy->a[i].fg.sortFlags;
    }
  }

  return pRet;
}